

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DividerClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DividerClauseSyntax,slang::syntax::DividerClauseSyntax_const&>
          (BumpAllocator *this,DividerClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  DividerClauseSyntax *pDVar13;
  
  pDVar13 = (DividerClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DividerClauseSyntax *)this->endPtr < pDVar13 + 1) {
    pDVar13 = (DividerClauseSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pDVar13 + 1);
  }
  (pDVar13->value).info = (args->value).info;
  SVar11 = (args->super_SyntaxNode).kind;
  uVar12 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->divide).kind;
  uVar8 = (args->divide).field_0x2;
  NVar9.raw = (args->divide).numFlags.raw;
  uVar10 = (args->divide).rawLen;
  TVar3 = (args->value).kind;
  uVar4 = (args->value).field_0x2;
  NVar5.raw = (args->value).numFlags.raw;
  uVar6 = (args->value).rawLen;
  (pDVar13->divide).info = (args->divide).info;
  (pDVar13->value).kind = TVar3;
  (pDVar13->value).field_0x2 = uVar4;
  (pDVar13->value).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar13->value).rawLen = uVar6;
  (pDVar13->super_SyntaxNode).previewNode = pSVar2;
  (pDVar13->divide).kind = TVar7;
  (pDVar13->divide).field_0x2 = uVar8;
  (pDVar13->divide).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar13->divide).rawLen = uVar10;
  (pDVar13->super_SyntaxNode).kind = SVar11;
  *(undefined4 *)&(pDVar13->super_SyntaxNode).field_0x4 = uVar12;
  (pDVar13->super_SyntaxNode).parent = pSVar1;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }